

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lubs.cpp
# Opt level: O0

LUBFinder wasm::LUB::getResultsLUB(Function *func,Module *wasm)

{
  bool bVar1;
  reference ppRVar2;
  reference ppCVar3;
  Function *this;
  Type type;
  reference ppCVar4;
  reference ppCVar5;
  Signature SVar6;
  byte local_312;
  HeapType local_2f0;
  Signature local_2e8;
  uintptr_t local_2d8;
  BasicType local_2cc;
  Type local_2c8;
  Type targetType;
  CallRef *call_2;
  iterator __end2_3;
  iterator __begin2_3;
  vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *__range2_3;
  CallIndirect *call_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_> *__range2_2;
  Call *call;
  iterator __end2_1;
  iterator __begin2_1;
  vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *__range2_1;
  anon_class_16_2_38787349 processReturnType;
  Return *ret;
  __normal_iterator<wasm::Return_**,_std::vector<wasm::Return_*,_std::allocator<wasm::Return_*>_>_>
  local_1b8;
  iterator __end2;
  iterator __begin2;
  vector<wasm::Return_*,_std::allocator<wasm::Return_*>_> *__range2;
  uintptr_t local_180;
  ReFinalize local_168;
  Type local_28;
  Type originalType;
  Module *wasm_local;
  Function *func_local;
  LUBFinder lub;
  
  originalType.id = (uintptr_t)wasm;
  LUBFinder::LUBFinder((LUBFinder *)&func_local);
  bVar1 = FeatureSet::hasGC((FeatureSet *)(originalType.id + 0x108));
  if (bVar1) {
    local_28 = Function::getResults(func);
    bVar1 = wasm::Type::hasRef(&local_28);
    if (bVar1) {
      ReFinalize::ReFinalize(&local_168);
      Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::
      walkFunctionInModule
                (&local_168.
                  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                  .
                  super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                  .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
                 func,(Module *)originalType.id);
      ReFinalize::~ReFinalize(&local_168);
      local_180 = (func->body->type).id;
      LUBFinder::note((LUBFinder *)&func_local,(Type)local_180);
      __range2 = (vector<wasm::Return_*,_std::allocator<wasm::Return_*>_> *)
                 LUBFinder::getLUB((LUBFinder *)&func_local);
      bVar1 = wasm::Type::operator==((Type *)&__range2,&local_28);
      if (!bVar1) {
        FindAll<wasm::Return>::FindAll((FindAll<wasm::Return> *)&__begin2,func->body);
        __end2 = std::vector<wasm::Return_*,_std::allocator<wasm::Return_*>_>::begin
                           ((vector<wasm::Return_*,_std::allocator<wasm::Return_*>_> *)&__begin2);
        local_1b8._M_current =
             (Return **)
             std::vector<wasm::Return_*,_std::allocator<wasm::Return_*>_>::end
                       ((vector<wasm::Return_*,_std::allocator<wasm::Return_*>_> *)&__begin2);
        while (bVar1 = __gnu_cxx::operator!=(&__end2,&local_1b8), bVar1) {
          ppRVar2 = __gnu_cxx::
                    __normal_iterator<wasm::Return_**,_std::vector<wasm::Return_*,_std::allocator<wasm::Return_*>_>_>
                    ::operator*(&__end2);
          LUBFinder::note((LUBFinder *)&func_local,(Type)((*ppRVar2)->value->type).id);
          processReturnType.originalType = (Type *)LUBFinder::getLUB((LUBFinder *)&func_local);
          bVar1 = wasm::Type::operator==((Type *)&processReturnType.originalType,&local_28);
          if (bVar1) {
            ret._4_4_ = 1;
            goto LAB_01e9a4c5;
          }
          __gnu_cxx::
          __normal_iterator<wasm::Return_**,_std::vector<wasm::Return_*,_std::allocator<wasm::Return_*>_>_>
          ::operator++(&__end2);
        }
        ret._4_4_ = 2;
LAB_01e9a4c5:
        FindAll<wasm::Return>::~FindAll((FindAll<wasm::Return> *)&__begin2);
        if (ret._4_4_ != 1) {
          __range2_1 = (vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)&func_local;
          processReturnType.lub = (LUBFinder *)&local_28;
          FindAll<wasm::Call>::FindAll((FindAll<wasm::Call> *)&__begin2_1,func->body);
          __end2_1 = std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::begin
                               ((vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)&__begin2_1);
          call = (Call *)std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>::end
                                   ((vector<wasm::Call_*,_std::allocator<wasm::Call_*>_> *)
                                    &__begin2_1);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end2_1,
                                    (__normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                                     *)&call), bVar1) {
            ppCVar3 = __gnu_cxx::
                      __normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
                      ::operator*(&__end2_1);
            if (((*ppCVar3)->isReturn & 1U) != 0) {
              this = Module::getFunction((Module *)originalType.id,
                                         (Name)((*ppCVar3)->target).super_IString.str);
              type = Function::getResults(this);
              bVar1 = getResultsLUB::anon_class_16_2_38787349::operator()
                                ((anon_class_16_2_38787349 *)&__range2_1,type);
              if (!bVar1) {
                ret._4_4_ = 1;
                goto LAB_01e9a64b;
              }
            }
            __gnu_cxx::
            __normal_iterator<wasm::Call_**,_std::vector<wasm::Call_*,_std::allocator<wasm::Call_*>_>_>
            ::operator++(&__end2_1);
          }
          ret._4_4_ = 4;
LAB_01e9a64b:
          FindAll<wasm::Call>::~FindAll((FindAll<wasm::Call> *)&__begin2_1);
          if (ret._4_4_ != 1) {
            FindAll<wasm::CallIndirect>::FindAll
                      ((FindAll<wasm::CallIndirect> *)&__begin2_2,func->body);
            __end2_2 = std::vector<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>::
                       begin((vector<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_> *)
                             &__begin2_2);
            call_1 = (CallIndirect *)
                     std::vector<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>::end
                               ((vector<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>
                                 *)&__begin2_2);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end2_2,
                                      (__normal_iterator<wasm::CallIndirect_**,_std::vector<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>_>
                                       *)&call_1), bVar1) {
              ppCVar4 = __gnu_cxx::
                        __normal_iterator<wasm::CallIndirect_**,_std::vector<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>_>
                        ::operator*(&__end2_2);
              local_312 = 0;
              if (((*ppCVar4)->isReturn & 1U) != 0) {
                SVar6 = HeapType::getSignature(&(*ppCVar4)->heapType);
                bVar1 = getResultsLUB::anon_class_16_2_38787349::operator()
                                  ((anon_class_16_2_38787349 *)&__range2_1,SVar6.results.id);
                local_312 = bVar1 ^ 0xff;
              }
              if ((local_312 & 1) != 0) {
                ret._4_4_ = 1;
                goto LAB_01e9a7c2;
              }
              __gnu_cxx::
              __normal_iterator<wasm::CallIndirect_**,_std::vector<wasm::CallIndirect_*,_std::allocator<wasm::CallIndirect_*>_>_>
              ::operator++(&__end2_2);
            }
            ret._4_4_ = 6;
LAB_01e9a7c2:
            FindAll<wasm::CallIndirect>::~FindAll((FindAll<wasm::CallIndirect> *)&__begin2_2);
            if (ret._4_4_ != 1) {
              FindAll<wasm::CallRef>::FindAll((FindAll<wasm::CallRef> *)&__begin2_3,func->body);
              __end2_3 = std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::begin
                                   ((vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)
                                    &__begin2_3);
              call_2 = (CallRef *)
                       std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>::end
                                 ((vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_> *)
                                  &__begin2_3);
              while( true ) {
                bVar1 = __gnu_cxx::operator!=
                                  (&__end2_3,
                                   (__normal_iterator<wasm::CallRef_**,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
                                    *)&call_2);
                if (!bVar1) break;
                ppCVar5 = __gnu_cxx::
                          __normal_iterator<wasm::CallRef_**,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
                          ::operator*(&__end2_3);
                targetType.id = (uintptr_t)*ppCVar5;
                if ((((CallRef *)targetType.id)->isReturn & 1U) != 0) {
                  local_2c8.id = (((CallRef *)targetType.id)->target->type).id;
                  local_2cc = unreachable;
                  bVar1 = wasm::Type::operator==(&local_2c8,&local_2cc);
                  if (!bVar1) {
                    local_2f0 = wasm::Type::getHeapType(&local_2c8);
                    SVar6 = HeapType::getSignature(&local_2f0);
                    local_2d8 = (uintptr_t)SVar6.results.id;
                    local_2e8 = SVar6;
                    bVar1 = getResultsLUB::anon_class_16_2_38787349::operator()
                                      ((anon_class_16_2_38787349 *)&__range2_1,(Type)local_2d8);
                    if (((bVar1 ^ 0xffU) & 1) != 0) break;
                  }
                }
                __gnu_cxx::
                __normal_iterator<wasm::CallRef_**,_std::vector<wasm::CallRef_*,_std::allocator<wasm::CallRef_*>_>_>
                ::operator++(&__end2_3);
              }
              FindAll<wasm::CallRef>::~FindAll((FindAll<wasm::CallRef> *)&__begin2_3);
            }
          }
        }
      }
    }
  }
  return (LUBFinder)(Type)func_local;
}

Assistant:

LUBFinder getResultsLUB(Function* func, Module& wasm) {
  LUBFinder lub;

  if (!wasm.features.hasGC()) {
    return lub;
  }

  Type originalType = func->getResults();
  if (!originalType.hasRef()) {
    // Nothing to refine.
    return lub;
  }

  // Before we do anything, we must refinalize the function, because otherwise
  // its body may contain a block with a forced type,
  //
  // (func (result X)
  //  (block (result X)
  //   (..content with more specific type Y..)
  //  )
  ReFinalize().walkFunctionInModule(func, &wasm);

  lub.note(func->body->type);
  if (lub.getLUB() == originalType) {
    return lub;
  }

  // Scan the body and look at the returns. First, return expressions.
  for (auto* ret : FindAll<Return>(func->body).list) {
    lub.note(ret->value->type);
    if (lub.getLUB() == originalType) {
      return lub;
    }
  }

  // Process return_calls and call_refs. Unlike return expressions which we
  // just handled, these only get a type to update, not a value.
  auto processReturnType = [&](Type type) {
    // Return whether we still look ok to do the optimization. If this is
    // false then we can stop here.
    lub.note(type);
    return lub.getLUB() != originalType;
  };

  for (auto* call : FindAll<Call>(func->body).list) {
    if (call->isReturn &&
        !processReturnType(wasm.getFunction(call->target)->getResults())) {
      return lub;
    }
  }
  for (auto* call : FindAll<CallIndirect>(func->body).list) {
    if (call->isReturn &&
        !processReturnType(call->heapType.getSignature().results)) {
      return lub;
    }
  }
  for (auto* call : FindAll<CallRef>(func->body).list) {
    if (call->isReturn) {
      auto targetType = call->target->type;
      if (targetType == Type::unreachable) {
        continue;
      }
      if (!processReturnType(targetType.getHeapType().getSignature().results)) {
        return lub;
      }
    }
  }

  return lub;
}